

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxSelf::Resolve(FxSelf *this,FCompileContext *ctx)

{
  PStruct *type;
  PPointer *pPVar1;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if ((ctx->Function == (PFunction *)0x0) ||
       (type = ((ctx->Function->Variants).Array)->SelfClass, type == (PStruct *)0x0)) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "self used outside of a member function");
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = (FxSelf *)0x0;
    }
    else {
      pPVar1 = NewPointer((PType *)type,false);
      (this->super_FxExpression).ValueType = (PType *)pPVar1;
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxSelf::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	if (ctx.Function == nullptr || ctx.Function->Variants[0].SelfClass == nullptr)
	{
		ScriptPosition.Message(MSG_ERROR, "self used outside of a member function");
		delete this;
		return nullptr;
	}
	ValueType = NewPointer(ctx.Function->Variants[0].SelfClass);
	return this;
}